

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotp.c
# Opt level: O0

char * mtotp_hotp_l(char *secret,size_t secret_len,uint64_t counter,int length,char *buf)

{
  uint32_t uVar1;
  uint8_t local_48 [4];
  uint32_t code;
  uint8_t hmac [20];
  char *buf_local;
  uint64_t uStack_20;
  int length_local;
  uint64_t counter_local;
  size_t secret_len_local;
  char *secret_local;
  
  unique0x1000013c = buf;
  uStack_20 = counter;
  counter_local = secret_len;
  secret_len_local = (size_t)secret;
  if (secret_len == 0) {
    __assert_fail("secret_len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                  ,0x22,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
  }
  if (5 < length) {
    uStack_20 = __bswap_64(counter);
    hmac_sha1((uint8_t *)secret_len_local,counter_local,(uint8_t *)&stack0xffffffffffffffe0,8,
              local_48);
    uVar1 = dynamic_truncate(local_48);
    uVar1 = mod(uVar1,length);
    pad_otp(uVar1,length,stack0xffffffffffffffd0);
    return stack0xffffffffffffffd0;
  }
  __assert_fail("length >= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                ,0x23,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
}

Assistant:

char *mtotp_hotp_l(const char *secret, size_t secret_len, uint64_t counter,
                   int length, char *buf) {
  assert(secret_len > 0);
  assert(length >= 6);

  counter = htobe64(counter);
  uint8_t hmac[20];
  hmac_sha1((const uint8_t *)secret, secret_len, (const uint8_t *)&counter,
            sizeof(counter), hmac);

  uint32_t code = mod(dynamic_truncate(hmac), length);

  pad_otp(code, length, buf);

  return buf;
}